

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar-memory-read-test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  size_t size;
  int iVar4;
  mtar_t tar;
  mtar_header_t h;
  char data [256];
  mtar_t mStack_278;
  mtar_header_t local_218;
  char local_138 [264];
  
  if (argc < 2) {
    puts("error: no argument");
    iVar4 = 1;
  }
  else {
    __stream = fopen(argv[1],"rb");
    if (__stream == (FILE *)0x0) {
      puts("error: unable to open");
      iVar4 = 6;
    }
    else {
      size = fread(main::buf,1,4000,__stream);
      if (size == 0) {
        puts("error: unable to read");
        fclose(__stream);
        iVar4 = 7;
      }
      else {
        fclose(__stream);
        uVar2 = mtar_open_memory(&mStack_278,main::buf,size);
        if (uVar2 == 0) {
          iVar4 = 0;
          do {
            uVar2 = mtar_read_header(&mStack_278,&local_218);
            if (uVar2 == 0xfffffff9) {
              iVar3 = 2;
            }
            else if (uVar2 == 0) {
              iVar3 = 0;
            }
            else {
              printf("error: %d\n",(ulong)uVar2);
              iVar4 = 5;
              iVar3 = 1;
            }
            if (iVar3 != 0) {
              if (iVar3 != 2) {
                return iVar4;
              }
              uVar2 = mtar_close(&mStack_278);
              if (uVar2 == 0) {
                puts("success");
                return 0;
              }
              printf("error: %d\n",(ulong)uVar2);
              return 3;
            }
            printf("%s (%d bytes)\n",local_218.name,(ulong)(uint)local_218.size);
            if (CONCAT44(local_218.size._4_4_,(uint)local_218.size) - 0x100 < 0xfffffffffffffeff) {
              puts("error: too large");
              iVar4 = 6;
LAB_001013ec:
              bVar1 = false;
            }
            else {
              uVar2 = mtar_read_data(&mStack_278,local_138,
                                     CONCAT44(local_218.size._4_4_,(uint)local_218.size));
              if (uVar2 != 0) {
                printf("error: %d\n",(ulong)uVar2);
                iVar4 = 4;
                goto LAB_001013ec;
              }
              local_138[CONCAT44(local_218.size._4_4_,(uint)local_218.size)] = '\0';
              puts(local_138);
              mtar_next(&mStack_278);
              bVar1 = true;
            }
          } while (bVar1);
        }
        else {
          printf("error: %d\n",(ulong)uVar2);
          iVar4 = 2;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
    mtar_t tar;
    mtar_header_t h;

    if (argc < 2)
    {
        printf("error: no argument\n");
        return 1;
    }

    FILE *fp = fopen(argv[1], "rb");
    if (!fp)
    {
        printf("error: unable to open\n");
        return 6;
    }

    static char buf[4000];
    size_t size = fread(buf, 1, 4000, fp);
    if (!size)
    {
        printf("error: unable to read\n");
        fclose(fp);
        return 7;
    }
    fclose(fp);

    if (int error = mtar_open_memory(&tar, buf, size))
    {
        printf("error: %d\n", error);
        return 2;
    }

    for (;;)
    {
        if (int error = mtar_read_header(&tar, &h))
        {
            if (error == MTAR_ENULLRECORD)
            {
                break;
            }
            printf("error: %d\n", error);
            return 5;
        }
        printf("%s (%d bytes)\n", h.name, (int)h.size);

        char data[256];
        if (h.size + 1 > sizeof(data))
        {
            printf("error: too large\n");
            return 6;
        }

        if (int error = mtar_read_data(&tar, data, h.size))
        {
            printf("error: %d\n", error);
            return 4;
        }
        data[h.size] = 0;

        puts(data);
        mtar_next(&tar);
    }

    if (int error = mtar_close(&tar))
    {
        printf("error: %d\n", error);
        return 3;
    }

    puts("success");
    return 0;
}